

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall rsasigner::rsasigner(rsasigner *this,string *filename)

{
  FILE *fp;
  RSA *pRVar1;
  sslerror *this_00;
  
  fp = fopen((filename->_M_dataplus)._M_p,"r");
  pRVar1 = PEM_read_RSAPrivateKey(fp,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
  this->_rsa = (RSA *)pRVar1;
  fclose(fp);
  if (this->_rsa != (RSA *)0x0) {
    return;
  }
  this_00 = (sslerror *)__cxa_allocate_exception(8);
  sslerror::sslerror(this_00,"d2i_RSAPrivateKey");
  __cxa_throw(this_00,&sslerror::typeinfo,0);
}

Assistant:

rsasigner(const std::string& filename)
    {
        FILE *f= fopen(filename.c_str(), "r");
        _rsa= PEM_read_RSAPrivateKey(f, NULL, 0, 0);
        fclose(f);
        if (_rsa==NULL)
            throw sslerror("d2i_RSAPrivateKey");
    }